

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O0

void __thiscall amrex::EB2::Level::Level(Level *this,IndexSpace *is,Geometry *geom)

{
  void *in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  FabArray<amrex::EBCellFlagFab> *this_00;
  array<amrex::MultiFab,_3UL> *this_01;
  
  memcpy(in_RDI,in_RDX,200);
  IntVect::IntVect((IntVect *)((long)in_RDI + 200));
  this_00 = (FabArray<amrex::EBCellFlagFab> *)((long)in_RDI + 0xd8);
  BoxArray::BoxArray((BoxArray *)this_00);
  this_01 = (array<amrex::MultiFab,_3UL> *)((long)in_RDI + 0x140);
  BoxArray::BoxArray((BoxArray *)this_00);
  DistributionMapping::DistributionMapping((DistributionMapping *)0x4c4340);
  MultiGFab::MultiGFab((MultiGFab *)this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  FabArray<amrex::EBCellFlagFab>::FabArray(this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  MultiFab::MultiFab((MultiFab *)this_00);
  std::array<amrex::MultiFab,_3UL>::array(this_01);
  std::array<amrex::MultiFab,_3UL>::array(this_01);
  std::array<amrex::MultiFab,_3UL>::array(this_01);
  *(undefined1 *)((long)in_RDI + 0x1ac8) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ac9) = 0;
  *(undefined8 *)((long)in_RDI + 0x1ad0) = in_RSI;
  return;
}

Assistant:

Level (IndexSpace const* is, const Geometry& geom) : m_geom(geom), m_parent(is) {}